

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::generateInternalFormatTextureGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  bool bVar1;
  char *__rhs;
  Enum<int,_2UL> EVar2;
  GLenum local_2ac;
  GetNameFunc local_298;
  int local_290;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  TextureLevelSpec level_1;
  TextureGenerationSpec texGen_2;
  GetNameFunc local_1c8;
  int local_1c0;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  TextureLevelSpec level;
  TextureGenerationSpec texGen_1;
  int baseSize;
  int internalFormatNdx;
  GetNameFunc local_c0;
  int local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  TextureGenerationSpec texGen;
  GLenum queryTarget;
  GLenum target_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  *group_local;
  
  local_2ac = target;
  if (target == 0x8513) {
    local_2ac = 0x8518;
  }
  texGen.description.field_2._8_4_ = local_2ac;
  texGen.description.field_2._12_4_ = target;
  TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)local_70);
  local_70._0_4_ = texGen.description.field_2._12_4_;
  local_70._4_4_ = texGen.description.field_2._8_4_;
  texGen.bindTarget._0_1_ = 1;
  texGen.queryTarget = 0;
  texGen.bindTarget._1_1_ = 1;
  EVar2 = glu::getTextureTargetStr(texGen.description.field_2._12_4_);
  local_c0 = EVar2.m_getName;
  local_b8 = EVar2.m_value;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_c0);
  std::operator+(&local_90,&local_b0,", initial values");
  std::__cxx11::string::operator=
            ((string *)
             &texGen.levels.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_70);
  TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_70);
  for (texGen_1.description.field_2._12_4_ = 0; (int)texGen_1.description.field_2._12_4_ < 0x36;
      texGen_1.description.field_2._12_4_ = texGen_1.description.field_2._12_4_ + 1) {
    bVar1 = isLegalFormatForTarget
                      (texGen.description.field_2._12_4_,
                       generateInternalFormatTextureGenerationGroup::internalFormats
                       [(int)texGen_1.description.field_2._12_4_]);
    if (bVar1) {
      texGen_1.description.field_2._8_4_ =
           getPixelSize(generateInternalFormatTextureGenerationGroup::internalFormats
                        [(int)texGen_1.description.field_2._12_4_]);
      TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level.internalFormat);
      TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_158);
      level.internalFormat = texGen.description.field_2._12_4_;
      level._20_4_ = texGen.description.field_2._8_4_;
      texGen_1.bindTarget._0_1_ = 1;
      bVar1 = isMultisampleTarget(texGen.description.field_2._12_4_);
      texGen_1.queryTarget = (GLenum)bVar1;
      EVar2 = glu::getTextureTargetStr(texGen.description.field_2._12_4_);
      texGen_2.description.field_2._8_8_ = EVar2.m_getName;
      local_1c0 = EVar2.m_value;
      local_1c8 = (GetNameFunc)texGen_2.description.field_2._8_8_;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1b8,&local_1c8);
      std::operator+(&local_198,&local_1b8,", internal format ");
      __rhs = glu::getTextureFormatName
                        (generateInternalFormatTextureGenerationGroup::internalFormats
                         [(int)texGen_1.description.field_2._12_4_]);
      std::operator+(&local_178,&local_198,__rhs);
      std::__cxx11::string::operator=
                ((string *)
                 &texGen_1.levels.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      if (texGen.description.field_2._12_4_ == 0x8c2a) {
        texGen_1.immutable = false;
        texGen_1.fixedSamplePos = false;
        texGen_1._10_2_ = 0;
        texGen_1.sampleCount = texGen_1.description.field_2._8_4_ * 0x21 + -1;
        texGen_1.texBufferDataOffset._0_1_ = 1;
      }
      local_158._0_4_ = 0x20;
      bVar1 = textureTypeHasHeight(texGen.description.field_2._12_4_);
      local_158._4_4_ = 1;
      if (bVar1) {
        local_158._4_4_ = 0x20;
      }
      bVar1 = textureTypeHasDepth(texGen.description.field_2._12_4_);
      level.width = (uint)bVar1 * 5 + 1;
      level.height = 0;
      level.depth = generateInternalFormatTextureGenerationGroup::internalFormats
                    [(int)texGen_1.description.field_2._12_4_];
      level.level._0_1_ = 0;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                   *)&texGen_1.bindWholeArray,(value_type *)local_158);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
      ::push_back(group,(value_type *)&level.internalFormat);
      TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level.internalFormat);
    }
  }
  bVar1 = targetSupportsMipLevels(texGen.description.field_2._12_4_);
  if (bVar1) {
    TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)&level_1.internalFormat);
    TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec((TextureLevelSpec *)local_248);
    level_1.internalFormat = texGen.description.field_2._12_4_;
    level_1._20_4_ = texGen.description.field_2._8_4_;
    texGen_2.bindTarget._0_1_ = 0;
    EVar2 = glu::getTextureTargetStr(texGen.description.field_2._12_4_);
    local_298 = EVar2.m_getName;
    local_290 = EVar2.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_298);
    std::operator+(&local_268,&local_288,", internal format GL_RGBA8, mip level 3");
    std::__cxx11::string::operator=
              ((string *)
               &texGen_2.levels.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    local_248._0_4_ = 0x20;
    local_248._4_4_ = 0x20;
    bVar1 = textureTypeHasDepth(texGen.description.field_2._12_4_);
    level_1.width = (uint)bVar1 * 5 + 1;
    level_1.height = 3;
    level_1.depth = 0x8058;
    level_1.level._0_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 *)&texGen_2.bindWholeArray,(value_type *)local_248);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(group,(value_type *)&level_1.internalFormat);
    TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)&level_1.internalFormat);
  }
  return;
}

Assistant:

static void generateInternalFormatTextureGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// Internal formats
	static const glw::GLenum internalFormats[] =
	{
		GL_R8, GL_R8_SNORM, GL_RG8, GL_RG8_SNORM, GL_RGB8, GL_RGB8_SNORM, GL_RGB565, GL_RGBA4, GL_RGB5_A1,
		GL_RGBA8, GL_RGBA8_SNORM, GL_RGB10_A2, GL_RGB10_A2UI, GL_SRGB8, GL_SRGB8_ALPHA8, GL_R16F, GL_RG16F,
		GL_RGB16F, GL_RGBA16F, GL_R32F, GL_RG32F, GL_RGB32F, GL_RGBA32F, GL_R11F_G11F_B10F, GL_RGB9_E5, GL_R8I,
		GL_R8UI, GL_R16I, GL_R16UI, GL_R32I, GL_R32UI, GL_RG8I, GL_RG8UI, GL_RG16I, GL_RG16UI, GL_RG32I, GL_RG32UI,
		GL_RGB8I, GL_RGB8UI, GL_RGB16I, GL_RGB16UI, GL_RGB32I, GL_RGB32UI, GL_RGBA8I, GL_RGBA8UI, GL_RGBA16I,
		GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI,

		GL_DEPTH_COMPONENT32F, GL_DEPTH_COMPONENT24, GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8, GL_DEPTH24_STENCIL8
	};

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.fixedSamplePos	= true;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// test all formats
	for (int internalFormatNdx = 0; internalFormatNdx < DE_LENGTH_OF_ARRAY(internalFormats); ++internalFormatNdx)
	{
		if (!isLegalFormatForTarget(target, internalFormats[internalFormatNdx]))
			continue;

		const int								baseSize = getPixelSize(internalFormats[internalFormatNdx]);
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= (isMultisampleTarget(target) ? (1) : (0));
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", internal format " + glu::getTextureFormatName(internalFormats[internalFormatNdx]);

		if (target == GL_TEXTURE_BUFFER)
		{
			texGen.texBufferDataOffset	= 0;
			texGen.texBufferDataSize	= 32 * baseSize + (baseSize - 1);
			texGen.bindWholeArray		= true;
		}

		level.width				= 32;
		level.height			= (textureTypeHasHeight(target)) ? (32) : (1);
		level.depth				= (textureTypeHasDepth(target)) ? (6) : (1);
		level.level				= 0;
		level.internalFormat	= internalFormats[internalFormatNdx];
		level.compressed		= false;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}

	// test mutable rgba8 with mip level 3
	if (targetSupportsMipLevels(target))
	{
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= false;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", internal format GL_RGBA8, mip level 3";

		level.width				= 32;
		level.height			= 32;
		level.depth				= (textureTypeHasDepth(target)) ? (6) : (1);
		level.level				= 3;
		level.internalFormat	= GL_RGBA8;
		level.compressed		= false;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}
}